

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Dumper::dump(Dumper *this,Slice slice)

{
  Sink *pSVar1;
  ValueLength VVar2;
  Slice local_20;
  
  this->_indentation = 0;
  pSVar1 = this->_sink;
  local_20._start = slice._start;
  VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     &local_20);
  (*pSVar1->_vptr_Sink[4])(pSVar1,VVar2);
  dumpValue(this,local_20,(Slice *)0x0);
  return;
}

Assistant:

void Dumper::dump(Slice slice) {
  _indentation = 0;
  _sink->reserve(slice.byteSize());
  dumpValue(slice);
}